

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_request.hpp
# Opt level: O3

void __thiscall libtorrent::dht::direct_observer::timeout(direct_observer *this)

{
  byte bVar1;
  bdecode_node e;
  msg m;
  undefined1 local_a8 [16];
  long local_98;
  undefined4 uStack_90;
  undefined4 local_8c;
  undefined1 auStack_88 [12];
  undefined4 local_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  data_union local_5c;
  msg local_40;
  
  bVar1 = (this->super_observer).flags.m_val;
  if (-1 < (char)bVar1) {
    (this->super_observer).flags.m_val = bVar1 | 0x80;
    auStack_88 = SUB1612((undefined1  [16])0x0,4);
    local_98 = 0;
    uStack_90 = 0;
    local_8c = 0;
    local_a8 = (undefined1  [16])0x0;
    local_7c = 0xffffffff;
    uStack_78 = 0xffffffff;
    uStack_74 = 0xffffffff;
    uStack_70 = 0xffffffff;
    observer::target_ep((endpoint *)&local_5c.base,&this->super_observer);
    local_40.addr.impl_.data_._0_8_ = local_5c._0_8_;
    local_40.addr.impl_.data_._20_8_ = local_5c._20_8_;
    local_40.message = (bdecode_node *)local_a8;
    direct_traversal::invoke_cb
              ((direct_traversal *)
               (this->super_observer).m_algorithm.
               super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&local_40);
    if ((void *)local_a8._0_8_ != (void *)0x0) {
      operator_delete((void *)local_a8._0_8_,local_98 - local_a8._0_8_);
    }
  }
  return;
}

Assistant:

void timeout() override
	{
		if (flags & flag_done) return;
		flags |= flag_done;
		bdecode_node e;
		msg m(e, target_ep());
		static_cast<direct_traversal*>(algorithm())->invoke_cb(m);
	}